

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathCastToNumber(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlXPathObjectPtr local_20;
  double ret;
  xmlXPathObjectPtr val_local;
  
  local_20 = (xmlXPathObjectPtr)0x0;
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local = (xmlXPathObjectPtr)0x7ff8000000000000;
  }
  else {
    switch(val->type) {
    case XPATH_UNDEFINED:
      local_20 = (xmlXPathObjectPtr)0x7ff8000000000000;
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      local_20 = (xmlXPathObjectPtr)xmlXPathCastNodeSetToNumber(val->nodesetval);
      break;
    case XPATH_BOOLEAN:
      local_20 = (xmlXPathObjectPtr)xmlXPathCastBooleanToNumber(val->boolval);
      break;
    case XPATH_NUMBER:
      local_20 = (xmlXPathObjectPtr)val->floatval;
      break;
    case XPATH_STRING:
      local_20 = (xmlXPathObjectPtr)xmlXPathCastStringToNumber(val->stringval);
      break;
    case XPATH_POINT:
    case XPATH_RANGE:
    case XPATH_LOCATIONSET:
    case XPATH_USERS:
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                ,0x1739);
      local_20 = (xmlXPathObjectPtr)0x7ff8000000000000;
    }
    val_local = local_20;
  }
  return (double)val_local;
}

Assistant:

double
xmlXPathCastToNumber(xmlXPathObjectPtr val) {
    double ret = 0.0;

    if (val == NULL)
	return(NAN);
    switch (val->type) {
    case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	xmlGenericError(xmlGenericErrorContext, "NUMBER: undefined\n");
#endif
	ret = NAN;
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	ret = xmlXPathCastNodeSetToNumber(val->nodesetval);
	break;
    case XPATH_STRING:
	ret = xmlXPathCastStringToNumber(val->stringval);
	break;
    case XPATH_NUMBER:
	ret = val->floatval;
	break;
    case XPATH_BOOLEAN:
	ret = xmlXPathCastBooleanToNumber(val->boolval);
	break;
    case XPATH_USERS:
    case XPATH_POINT:
    case XPATH_RANGE:
    case XPATH_LOCATIONSET:
	TODO;
	ret = NAN;
	break;
    }
    return(ret);
}